

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  value_type_conflict *__val;
  undefined4 extraout_var;
  size_t sVar5;
  ostream *this;
  string *this_00;
  char *__s;
  initializer_list<double> __l;
  int num_element;
  int num_data;
  double entropy;
  vector<double,_std::allocator<double>_> average_entropy;
  ostringstream error_message_4;
  StatisticsAccumulation statistics_accumulation;
  vector<double,_std::allocator<double>_> probability;
  EntropyCalculation entropy_calculation;
  Buffer buffer;
  ifstream ifs;
  int local_4dc;
  string local_4d8;
  EntropyUnits local_4b4;
  ulong local_4b0;
  int local_4a4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4a0;
  vector<double,_std::allocator<double>_> local_498;
  string local_478 [3];
  ios_base local_408 [264];
  StatisticsAccumulation local_300;
  vector<double,_std::allocator<double>_> local_2e8;
  EntropyCalculation local_2d0;
  Buffer local_2b8;
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_4dc = 0x100;
  local_4b0 = 0;
  local_4b4 = kBit;
LAB_0010372e:
  while( true ) {
    iVar4 = ya_getopt_long(argc,argv,"l:o:fh",(option *)0x0,(int *)0x0);
    if (iVar4 != 0x6c) break;
    std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_478);
    bVar1 = sptk::ConvertStringToInteger(&local_238,&local_4dc);
    bVar2 = local_4dc < 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if (!bVar1 || bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -l option must be a positive integer",
                 0x39);
      local_478[0]._M_dataplus._M_p = (pointer)&local_478[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"entropy","");
      sptk::PrintErrorMessage(local_478,(ostringstream *)&local_238);
LAB_00103a9c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478[0]._M_dataplus._M_p != &local_478[0].field_2) {
        operator_delete(local_478[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
      return 1;
    }
  }
  if (iVar4 < 0x68) {
    if (iVar4 == -1) {
      if (1 < argc - ya_optind) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"Too many input files",0x14);
        local_478[0]._M_dataplus._M_p = (pointer)&local_478[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"entropy","");
        sptk::PrintErrorMessage(local_478,(ostringstream *)&local_238);
        goto LAB_00103a9c;
      }
      if (argc == ya_optind) {
        __s = (char *)0x0;
      }
      else {
        __s = argv[ya_optind];
      }
      bVar2 = sptk::SetBinaryMode();
      this_00 = &local_238;
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Cannot set translation mode",0x1b);
        local_478[0]._M_dataplus._M_p = (pointer)&local_478[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"entropy","");
        sptk::PrintErrorMessage(local_478,(ostringstream *)&local_238);
        goto LAB_00103a9c;
      }
      std::ifstream::ifstream(this_00);
      if ((__s != (char *)0x0) &&
         (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s),
         (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_478,"Cannot open file ",0x11);
        sVar5 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_478,__s,sVar5);
        local_2b8._vptr_Buffer = (_func_int **)&local_2b8.first_order_statistics_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"entropy","");
        sptk::PrintErrorMessage((string *)&local_2b8,(ostringstream *)local_478);
        if ((vector<double,_std::allocator<double>_> *)local_2b8._vptr_Buffer !=
            &local_2b8.first_order_statistics_) {
          operator_delete(local_2b8._vptr_Buffer);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
        std::ios_base::~ios_base(local_408);
        iVar4 = 1;
        goto LAB_00103d1c;
      }
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        this_00 = (string *)&std::cin;
      }
      sptk::StatisticsAccumulation::StatisticsAccumulation(&local_300,0,1,false,false);
      sptk::StatisticsAccumulation::Buffer::Buffer(&local_2b8);
      sptk::EntropyCalculation::EntropyCalculation(&local_2d0,local_4dc,local_4b4);
      if ((local_300.is_valid_ == true) && (local_2d0.is_valid_ != false)) {
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_2e8,(long)local_4dc,(allocator_type *)local_478);
        goto LAB_00103b85;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_478,"Failed to initialize EntropyCalculation",0x27);
      local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"entropy","");
      sptk::PrintErrorMessage(&local_4d8,(ostringstream *)local_478);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
        operator_delete(local_4d8._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
      std::ios_base::~ios_base(local_408);
      iVar4 = 1;
      goto LAB_00103d0f;
    }
    if (iVar4 == 0x66) {
      local_4b0 = CONCAT71((int7)(CONCAT44(extraout_var,iVar4) >> 8),1);
      goto LAB_0010372e;
    }
  }
  else {
    if (iVar4 == 0x68) {
      anon_unknown.dwarf_3014::PrintUsage((ostream *)&std::cout);
      return 0;
    }
    if (iVar4 == 0x6f) {
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_478);
      bVar2 = sptk::ConvertStringToInteger(&local_238,(int *)&local_2b8);
      if (bVar2) {
        bVar2 = sptk::IsInRange((EntropyUnits)local_2b8._vptr_Buffer,0,2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (bVar2) {
          local_4b4 = (EntropyUnits)local_2b8._vptr_Buffer;
          goto LAB_0010372e;
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -o option must be an integer ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"in the range of ",0x10);
      this = (ostream *)std::ostream::operator<<((ostream *)&local_238,0);
      std::__ostream_insert<char,std::char_traits<char>>(this," to ",4);
      std::ostream::operator<<((ostream *)this,2);
      local_478[0]._M_dataplus._M_p = (pointer)&local_478[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"entropy","");
      sptk::PrintErrorMessage(local_478,(ostringstream *)&local_238);
      goto LAB_00103a9c;
    }
  }
  anon_unknown.dwarf_3014::PrintUsage((ostream *)&std::cerr);
  return 1;
LAB_00103b85:
  bVar2 = sptk::ReadStream<double>(false,0,0,local_4dc,&local_2e8,(istream *)this_00,(int *)0x0);
  if (!bVar2) {
    bVar2 = sptk::StatisticsAccumulation::GetNumData(&local_300,&local_2b8,&local_4a4);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_478,"Failed to accumulate statistics",0x1f);
      local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"entropy","");
      sptk::PrintErrorMessage(&local_4d8,(ostringstream *)local_478);
      goto LAB_00103ff7;
    }
    if ((local_4b0 & 1) == 0 && 0 < local_4a4) {
      local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)operator_new(8);
      local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + 1;
      *local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start = 0.0;
      local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      bVar2 = sptk::StatisticsAccumulation::GetMean(&local_300,&local_2b8,&local_498);
      if (bVar2) {
        iVar4 = 0;
        bVar1 = sptk::WriteStream<double>(0,1,&local_498,(ostream *)&std::cout,(int *)0x0);
        bVar2 = true;
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_478,"Failed to write entropy",0x17);
          local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"entropy","");
          sptk::PrintErrorMessage(&local_4d8,(ostringstream *)local_478);
          goto LAB_00104094;
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_478,"Failed to calculate entropy",0x1b);
        local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"entropy","");
        sptk::PrintErrorMessage(&local_4d8,(ostringstream *)local_478);
LAB_00104094:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
          operator_delete(local_4d8._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
        std::ios_base::~ios_base(local_408);
        iVar4 = 1;
        bVar2 = false;
      }
      if (local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (!bVar2) goto LAB_00104029;
    }
    iVar4 = 0;
    goto LAB_00104029;
  }
  bVar2 = sptk::EntropyCalculation::Run(&local_2d0,&local_2e8,(double *)&local_4a0);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_478,"Failed to calculate entropy",0x1b);
    local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"entropy","");
    sptk::PrintErrorMessage(&local_4d8,(ostringstream *)local_478);
    goto LAB_00103ff7;
  }
  if ((local_4b0 & 1) != 0) {
    bVar2 = sptk::WriteStream<double>((double)local_4a0,(ostream *)&std::cout);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_478,"Failed to write entropy",0x17);
      local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"entropy","");
      sptk::PrintErrorMessage(&local_4d8,(ostringstream *)local_478);
      goto LAB_00103ff7;
    }
    goto LAB_00103b85;
  }
  local_4d8._M_dataplus._M_p = (pointer)local_4a0;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_4d8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_478,__l,(allocator_type *)&local_498);
  bVar2 = sptk::StatisticsAccumulation::Run
                    (&local_300,(vector<double,_std::allocator<double>_> *)local_478,&local_2b8);
  if (local_478[0]._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_478[0]._M_dataplus._M_p);
  }
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_478,"Failed to accumulate statistics",0x1f);
    local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"entropy","");
    sptk::PrintErrorMessage(&local_4d8,(ostringstream *)local_478);
LAB_00103ff7:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
      operator_delete(local_4d8._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
    std::ios_base::~ios_base(local_408);
    iVar4 = 1;
LAB_00104029:
    if (local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
LAB_00103d0f:
    sptk::StatisticsAccumulation::Buffer::~Buffer(&local_2b8);
LAB_00103d1c:
    std::ifstream::~ifstream(&local_238);
    return iVar4;
  }
  goto LAB_00103b85;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_element(kDefaultNumElement);
  sptk::EntropyCalculation::EntropyUnits entropy_unit(kDefaultEntropyUnit);
  bool output_frame_by_frame(kDefaultOutputFrameByFrameFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:o:fh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_element) ||
            num_element <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("entropy", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(
                          sptk::EntropyCalculation::EntropyUnits::kNumUnits) -
                      1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("entropy", error_message);
          return 1;
        }
        entropy_unit = static_cast<sptk::EntropyCalculation::EntropyUnits>(tmp);
        break;
      }
      case 'f': {
        output_frame_by_frame = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("entropy", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("entropy", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("entropy", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::StatisticsAccumulation statistics_accumulation(0, 1);
  sptk::StatisticsAccumulation::Buffer buffer;
  sptk::EntropyCalculation entropy_calculation(num_element, entropy_unit);
  if (!statistics_accumulation.IsValid() || !entropy_calculation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize EntropyCalculation";
    sptk::PrintErrorMessage("entropy", error_message);
    return 1;
  }

  std::vector<double> probability(num_element);
  double entropy;

  while (sptk::ReadStream(false, 0, 0, num_element, &probability, &input_stream,
                          NULL)) {
    if (!entropy_calculation.Run(probability, &entropy)) {
      std::ostringstream error_message;
      error_message << "Failed to calculate entropy";
      sptk::PrintErrorMessage("entropy", error_message);
      return 1;
    }

    if (output_frame_by_frame) {
      if (!sptk::WriteStream(entropy, &std::cout)) {
        std::ostringstream error_message;
        error_message << "Failed to write entropy";
        sptk::PrintErrorMessage("entropy", error_message);
        return 1;
      }
    } else {
      if (!statistics_accumulation.Run(std::vector<double>{entropy}, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to accumulate statistics";
        sptk::PrintErrorMessage("entropy", error_message);
        return 1;
      }
    }
  }

  int num_data;
  if (!statistics_accumulation.GetNumData(buffer, &num_data)) {
    std::ostringstream error_message;
    error_message << "Failed to accumulate statistics";
    sptk::PrintErrorMessage("entropy", error_message);
    return 1;
  }

  if (!output_frame_by_frame && 0 < num_data) {
    std::vector<double> average_entropy(1);
    if (!statistics_accumulation.GetMean(buffer, &average_entropy)) {
      std::ostringstream error_message;
      error_message << "Failed to calculate entropy";
      sptk::PrintErrorMessage("entropy", error_message);
      return 1;
    }
    if (!sptk::WriteStream(0, 1, average_entropy, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write entropy";
      sptk::PrintErrorMessage("entropy", error_message);
      return 1;
    }
  }

  return 0;
}